

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.h
# Opt level: O0

int __thiscall MlmWrap::processOtherMsg(MlmWrap *this,char *sender,char *subject,TrodesMsg *msg)

{
  ostream *poVar1;
  char *in_RDX;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Other msg type [");
  poVar1 = std::operator<<(poVar1,in_RDX);
  std::operator<<(poVar1,"] not recognized.\n");
  return 0;
}

Assistant:

virtual int processOtherMsg(const char *sender, const char *subject, TrodesMsg &msg) {std::cout << "Other msg type [" << subject << "] not recognized.\n"; return(0);}